

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O2

void __thiscall correctness_string_conv_Test::TestBody(correctness_string_conv_Test *this)

{
  char *pcVar1;
  allocator<char> local_111;
  AssertionResult gtest_ar;
  string local_100;
  big_integer local_e0;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"100",&local_111);
  big_integer::big_integer(&local_e0,&local_28);
  to_string_abi_cxx11_(&local_100,&local_e0);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)&gtest_ar,"to_string(big_integer(\"100\"))","\"100\"",&local_100,
             (char (*) [4])0x1342a3);
  std::__cxx11::string::~string((string *)&local_100);
  big_integer::~big_integer(&local_e0);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_e0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
               ,0x25b,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_e0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"0100",&local_111);
  big_integer::big_integer(&local_e0,&local_48);
  to_string_abi_cxx11_(&local_100,&local_e0);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)&gtest_ar,"to_string(big_integer(\"0100\"))","\"100\"",&local_100,
             (char (*) [4])0x1342a3);
  std::__cxx11::string::~string((string *)&local_100);
  big_integer::~big_integer(&local_e0);
  std::__cxx11::string::~string((string *)&local_48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_e0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
               ,0x25c,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_e0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"0",&local_111);
  big_integer::big_integer(&local_e0,&local_68);
  to_string_abi_cxx11_(&local_100,&local_e0);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[2]>
            ((internal *)&gtest_ar,"to_string(big_integer(\"0\"))","\"0\"",&local_100,
             (char (*) [2])0x1344ac);
  std::__cxx11::string::~string((string *)&local_100);
  big_integer::~big_integer(&local_e0);
  std::__cxx11::string::~string((string *)&local_68);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_e0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
               ,0x25d,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_e0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"-0",&local_111);
  big_integer::big_integer(&local_e0,&local_88);
  to_string_abi_cxx11_(&local_100,&local_e0);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[2]>
            ((internal *)&gtest_ar,"to_string(big_integer(\"-0\"))","\"0\"",&local_100,
             (char (*) [2])0x1344ac);
  std::__cxx11::string::~string((string *)&local_100);
  big_integer::~big_integer(&local_e0);
  std::__cxx11::string::~string((string *)&local_88);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_e0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
               ,0x25e,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_e0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"-1000000000000000",&local_111);
  big_integer::big_integer(&local_e0,&local_a8);
  to_string_abi_cxx11_(&local_100,&local_e0);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[18]>
            ((internal *)&gtest_ar,"to_string(big_integer(\"-1000000000000000\"))",
             "\"-1000000000000000\"",&local_100,(char (*) [18])"-1000000000000000");
  std::__cxx11::string::~string((string *)&local_100);
  big_integer::~big_integer(&local_e0);
  std::__cxx11::string::~string((string *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_e0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
               ,0x25f,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_e0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(correctness, string_conv)
{
    EXPECT_EQ(to_string(big_integer("100")), "100");
    EXPECT_EQ(to_string(big_integer("0100")), "100");
    EXPECT_EQ(to_string(big_integer("0")), "0");
    EXPECT_EQ(to_string(big_integer("-0")), "0");
    EXPECT_EQ(to_string(big_integer("-1000000000000000")), "-1000000000000000");
}